

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvisualmatrix.cpp
# Opt level: O2

void VisualMatrixDX<float>(TPZFMatrix<float> *matrix,string *outfilename)

{
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  float *pfVar4;
  ulong uVar5;
  ulong col;
  ulong uVar6;
  ulong row;
  ofstream out;
  undefined8 auStack_228 [63];
  
  uVar1 = (uint)(matrix->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
  uVar2 = (uint)(matrix->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  std::ofstream::ofstream((ostream *)&out,(outfilename->_M_dataplus)._M_p,_S_out|_S_bin);
  std::operator<<((ostream *)&out,"# Graphical Visualization of Matrix.\n");
  std::operator<<((ostream *)&out,"# Positions as the indexes of the matrix, beginning by column.\n"
                 );
  std::operator<<((ostream *)&out,
                  "# The number of elements in x direction correspond to the number of the columns of the matrix.\n"
                 );
  std::operator<<((ostream *)&out,
                  "# The number of elements in y direction correspond to the number of the rows of the matrix.\n"
                 );
  poVar3 = std::operator<<((ostream *)&out,"object 1 class gridpositions counts ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2 + 1);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1 + 1);
  std::operator<<(poVar3,"\n");
  std::operator<<((ostream *)&out,"origin 0. 0.\n");
  std::operator<<((ostream *)&out,"delta 1. 0.\n");
  std::operator<<((ostream *)&out,"delta 0. 1.\n");
  poVar3 = std::operator<<((ostream *)&out,"attribute \"dep\" string \"positions\"");
  std::operator<<(poVar3,"\n");
  std::operator<<((ostream *)&out,"\n");
  std::ostream::flush();
  poVar3 = std::operator<<((ostream *)&out,"object 2 class gridconnections counts ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2 + 1);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1 + 1);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&out,"attribute \"element type\" string \"quads\"");
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&out,"attribute \"ref\" string \"positions\"");
  std::operator<<(poVar3,"\n");
  *(undefined8 *)((long)auStack_228 + *(long *)(_out + -0x18)) = 5;
  poVar3 = std::operator<<((ostream *)&out,"object 3 class array type float rank 0 items ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1 * uVar2);
  std::operator<<(poVar3," data follows\n");
  row = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = row;
  }
  uVar6 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar6 = row;
  }
  for (; row != uVar6; row = row + 1) {
    for (col = 0; uVar5 != col; col = col + 1) {
      pfVar4 = TPZFMatrix<float>::operator()(matrix,row,col);
      poVar3 = (ostream *)std::ostream::operator<<(&out,*pfVar4);
      std::operator<<(poVar3,"\n");
    }
  }
  poVar3 = std::operator<<((ostream *)&out,"attribute \"dep\" string \"connections\" ");
  std::operator<<(poVar3,"\n");
  std::ostream::flush();
  std::operator<<((ostream *)&out,"\n");
  std::ostream::flush();
  std::operator<<((ostream *)&out,"object 4 class field\n");
  std::operator<<((ostream *)&out,"component \"data\" value 3\n");
  std::operator<<((ostream *)&out,"component \"positions\" value 1\n");
  std::operator<<((ostream *)&out,"component \"connections\" value 2\n");
  poVar3 = std::operator<<((ostream *)&out,"attribute \"name\" string \"Matrix\"");
  std::operator<<(poVar3,"\n");
  std::ostream::flush();
  std::operator<<((ostream *)&out,"\n");
  std::operator<<((ostream *)&out,"end\n");
  std::ostream::flush();
  std::ofstream::close();
  poVar3 = std::operator<<((ostream *)&std::cout,"Data Explorer file ");
  poVar3 = std::operator<<(poVar3,(string *)outfilename);
  std::operator<<(poVar3," was created with success!\n");
  std::ofstream::~ofstream(&out);
  return;
}

Assistant:

void VisualMatrixDX(TPZFMatrix<TVar> & matrix, const std::string &outfilename)
{
	const int nelx = matrix.Cols();
	const int nely = matrix.Rows();
	const int neltotal = nelx * nely;
	int i,j;
	ofstream out(outfilename.c_str(), ofstream::out | ofstream::binary); // binary prevents translation of "\n" under windows
	out << "# Graphical Visualization of Matrix.\n" ; 
	out << "# Positions as the indexes of the matrix, beginning by column.\n" ;
	out << "# The number of elements in x direction correspond to the number of the columns of the matrix.\n" ;
	out << "# The number of elements in y direction correspond to the number of the rows of the matrix.\n" ;
	
	out  << "object 1 class gridpositions counts " << nelx+1 << " " << nely +1 << "\n";
	out << "origin 0. 0.\n" ;
	out << "delta 1. 0.\n" ;
	out << "delta 0. 1.\n" ;
	out << "attribute \"dep\" string \"positions\"" << "\n" ;
	out << "\n" << std::flush;
	
	
	out << "object 2 class gridconnections counts " << nelx+1 << " " << nely +1 << "\n" ;
	
 	out << "attribute \"element type\" string \"quads\"" << "\n" ;
	out << "attribute \"ref\" string \"positions\"" << "\n" ;
	
	out.precision(5);
	out  << "object 3 class array type float rank 0 items " << neltotal << " data follows\n" ;
	for (i = 0; i < nelx; i++) {
		for(j=0; j< nely ; j++) out << matrix(i,j) << "\n" ;
	}
	out << "attribute \"dep\" string \"connections\" " << "\n" << std::flush;
	out << "\n" << std::flush;
	
	out << "object 4 class field\n" ;
	out << "component \"data\" value 3\n" ;
	out << "component \"positions\" value 1\n" ;
	out << "component \"connections\" value 2\n" ;
	out << "attribute \"name\" string \"Matrix\"" << "\n" << std::flush;
	
	out << "\n" ;
	out << "end\n" << std::flush;
	
	out.close();
	
	cout << "Data Explorer file " << outfilename << " was created with success!\n";
}